

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

size_t enet_range_coder_decompress
                 (void *context,enet_uint8 *inData,size_t inLimit,enet_uint8 *outData,
                 size_t outLimit)

{
  byte bVar1;
  ushort uVar2;
  enet_uint16 eVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  short sVar7;
  ushort uVar8;
  uint uVar9;
  undefined8 *puVar10;
  short sVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ENetSymbol *pEVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort *puVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  enet_uint16 predicted;
  ushort local_92;
  ulong local_90;
  int local_84;
  ushort *local_80;
  ENetSymbol *local_78;
  undefined8 *local_70;
  long local_68;
  byte *local_60;
  byte *local_58;
  ulong local_50;
  byte *local_48;
  ENetSymbol *local_40;
  enet_uint8 *local_38;
  
  local_92 = 0;
  uVar4 = 0;
  if (inLimit == 0 || context == (void *)0x0) {
    return 0;
  }
  local_60 = inData + inLimit;
  *(undefined8 *)context = 0;
  *(undefined8 *)((long)context + 8) = 0;
  *(undefined4 *)((long)context + 10) = 0x1010001;
  if (0 < (long)inLimit) {
    bVar26 = *inData;
    inData = inData + 1;
    uVar4 = (uint)bVar26 << 0x18;
  }
  if (inData < local_60) {
    bVar26 = *inData;
    inData = inData + 1;
    uVar4 = (uint)bVar26 << 0x10 | uVar4;
  }
  if (inData < local_60) {
    bVar26 = *inData;
    inData = inData + 1;
    uVar4 = (uint)bVar26 << 8 | uVar4;
  }
  if (inData < local_60) {
    bVar26 = *inData;
    inData = inData + 1;
    uVar4 = uVar4 | bVar26;
  }
  local_58 = outData + outLimit;
  uVar15 = 0xffffffff;
  local_80 = (ushort *)0x0;
  local_50 = 0;
  uVar29 = 0;
  local_90 = 1;
  local_70 = (undefined8 *)context;
  local_38 = outData;
LAB_00102da2:
  uVar23 = (ushort)local_80;
  uVar22 = (ulong)local_80;
  while (local_48 = outData, uVar23 != 0) {
    local_84 = (int)uVar22;
    lVar20 = (long)context + (ulong)(uint)(local_84 << 4);
    uVar23 = *(ushort *)((long)context + (ulong)(uint)(local_84 << 4) + 10);
    if (uVar23 != 0) {
      uVar2 = *(ushort *)(lVar20 + 0xc);
      if (uVar23 < uVar2) {
        uVar12 = (uint)((ulong)(uVar4 - uVar29) / ((ulong)uVar15 / (ulong)uVar2));
        uVar9 = (uint)uVar23;
        iVar16 = (int)((ulong)uVar15 / (ulong)uVar2);
        if ((uVar12 & 0xffff) < uVar9) {
          uVar15 = iVar16 * uVar9;
          do {
            if (0xffffff < (uVar29 + uVar15 ^ uVar29)) {
              if (0xffff < uVar15) goto LAB_00102e3b;
              uVar15 = -uVar29 & 0xffff;
            }
            uVar4 = uVar4 << 8;
            if (inData < local_60) {
              bVar26 = *inData;
              inData = inData + 1;
              uVar4 = uVar4 | bVar26;
            }
            uVar15 = uVar15 << 8;
            uVar29 = uVar29 << 8;
          } while( true );
        }
        if (*(ushort *)(lVar20 + 8) == 0) {
          return 0;
        }
        uVar12 = uVar12 - uVar9;
        local_40 = (ENetSymbol *)((ulong)*(ushort *)(lVar20 + 8) * 0x10 + lVar20);
        local_78 = local_40;
        uVar23 = 0;
        goto LAB_00103395;
      }
    }
LAB_00102e3b:
    uVar23 = *(ushort *)(lVar20 + 0xe);
    uVar22 = (ulong)uVar23;
  }
  uVar22 = (ulong)uVar15 / (ulong)*(ushort *)((long)context + 0xc);
  uVar15 = (uint)((uVar4 - uVar29) / uVar22);
  uVar23 = *(ushort *)((long)context + 10);
  iVar16 = (int)uVar22;
  if ((uVar15 & 0xffff) < (uint)uVar23) {
    uVar4 = iVar16 * (uint)uVar23;
    do {
      if (0xffffff < (uVar29 + uVar4 ^ uVar29)) {
        if (0xffff < uVar4) {
          return (long)outData - (long)local_38;
        }
        uVar4 = -uVar29 & 0xffff;
      }
      uVar4 = uVar4 << 8;
      uVar29 = uVar29 << 8;
    } while( true );
  }
  uVar15 = uVar15 - uVar23;
  if (*(ushort *)((long)context + 8) != 0) {
    local_78 = (ENetSymbol *)((long)context + (ulong)*(ushort *)((long)context + 8) * 2 * 8);
    uVar9 = uVar15 & 0xffff;
    uVar12 = 0;
    do {
      uVar23 = local_78->under;
      uVar19 = (uVar12 & 0xffff) + (uint)uVar23;
      bVar26 = local_78->value;
      uVar28 = (uint)bVar26;
      uVar21 = uVar19 + bVar26 + 1;
      uVar18 = uVar21 & 0xffff;
      if (uVar9 < uVar18) {
        bVar27 = local_78->count;
        uVar18 = uVar18 + ~(uint)bVar27;
        if ((int)uVar18 <= (int)uVar9) {
          uVar12 = bVar27 + 1;
          local_78->under = uVar23 + 3;
          local_78->count = bVar27 + 3;
          goto LAB_00103001;
        }
        local_78->under = uVar23 + 3;
        eVar3 = local_78->left;
        if (eVar3 == 0) goto LAB_00102fb1;
      }
      else {
        eVar3 = local_78->right;
        uVar12 = uVar19;
        if (eVar3 == 0) {
          uVar28 = (bVar26 + 1 + uVar9) - uVar21;
          lVar20 = local_90 * 0x10;
          pEVar17 = (ENetSymbol *)((long)context + local_90 * 2 * 8);
          *(char *)((long)context + local_90 * 2 * 8) = (char)uVar28;
          *(undefined1 *)((long)context + lVar20 + 1) = 3;
          *(undefined2 *)((long)context + lVar20 + 2) = 3;
          *(undefined8 *)((long)context + lVar20 + 4) = 0;
          *(undefined4 *)((long)context + lVar20 + 0xc) = 0;
          local_78->right = (enet_uint16)((uint)((int)pEVar17 - (int)local_78) >> 4);
          goto LAB_00102ff4;
        }
      }
      local_78 = local_78 + eVar3;
    } while( true );
  }
  lVar20 = local_90 * 0x10;
  *(char *)((long)context + local_90 * 2 * 8) = (char)uVar15;
  *(undefined1 *)((long)context + lVar20 + 1) = 3;
  *(undefined2 *)((long)context + lVar20 + 2) = 3;
  *(undefined8 *)((long)context + lVar20 + 4) = 0;
  *(undefined4 *)((long)context + lVar20 + 0xc) = 0;
  *(short *)((long)context + 8) = (short)local_90;
  uVar12 = 1;
  local_78 = (ENetSymbol *)((long)context + local_90 * 2 * 8);
  local_90 = local_90 + 1;
  uVar18 = uVar15;
  uVar28 = uVar15;
  goto LAB_00103001;
LAB_00103395:
  eVar3 = local_78->under;
  uVar24 = uVar23 + eVar3;
  if ((ushort)uVar12 < uVar24) {
    bVar26 = local_78->count;
    uVar15 = (uint)uVar24 - (uint)bVar26;
    if ((int)uVar15 <= (int)(uVar12 & 0xffff)) goto LAB_001033e1;
    local_78->under = eVar3 + 2;
    uVar8 = local_78->left;
    uVar24 = uVar23;
  }
  else {
    uVar8 = local_78->right;
  }
  if (uVar8 == 0) {
    return 0;
  }
  local_78 = local_78 + uVar8;
  uVar23 = uVar24;
  goto LAB_00103395;
LAB_001033e1:
  bVar27 = local_78->value;
  local_78->under = eVar3 + 2;
  local_78->count = bVar26 + 2;
  uVar29 = ((uVar15 & 0xffff) + uVar9) * iVar16 + uVar29;
  uVar15 = iVar16 * (uint)bVar26;
  do {
    if (0xffffff < (uVar29 + uVar15 ^ uVar29)) {
      if (0xffff < uVar15) break;
      uVar15 = -uVar29 & 0xffff;
    }
    uVar4 = uVar4 << 8;
    if (inData < local_60) {
      bVar1 = *inData;
      inData = inData + 1;
      uVar4 = uVar4 | bVar1;
    }
    uVar15 = uVar15 << 8;
    uVar29 = uVar29 << 8;
  } while( true );
  *(ushort *)(lVar20 + 0xc) = uVar2 + 2;
  local_68 = lVar20;
  if ((0xff00 < (ushort)(uVar2 + 2)) ||
     (context = local_70, puVar25 = local_80, iVar16 = local_84, 0xfb < bVar26)) {
    eVar3 = enet_symbol_rescale(local_40);
    sVar7 = *(ushort *)(local_68 + 10) - (*(ushort *)(local_68 + 10) >> 1);
    *(short *)(local_68 + 10) = sVar7;
    *(enet_uint16 *)(local_68 + 0xc) = sVar7 + eVar3;
    context = local_70;
    puVar25 = local_80;
    iVar16 = local_84;
  }
  goto LAB_001030d2;
LAB_00102fb1:
  bVar26 = bVar26 + ((char)uVar9 - (char)uVar18);
  uVar28 = (uint)bVar26;
  lVar20 = local_90 * 0x10;
  pEVar17 = (ENetSymbol *)((long)context + local_90 * 2 * 8);
  *(byte *)((long)context + local_90 * 2 * 8) = bVar26;
  *(undefined1 *)((long)context + lVar20 + 1) = 3;
  *(undefined2 *)((long)context + lVar20 + 2) = 3;
  *(undefined8 *)((long)context + lVar20 + 4) = 0;
  *(undefined4 *)((long)context + lVar20 + 0xc) = 0;
  local_78->left = (enet_uint16)((uint)((int)pEVar17 - (int)local_78) >> 4);
LAB_00102ff4:
  local_90 = local_90 + 1;
  uVar12 = 1;
  local_78 = pEVar17;
  uVar18 = uVar15;
LAB_00103001:
  bVar27 = (byte)uVar28;
  uVar23 = *(ushort *)((long)context + 10);
  uVar29 = ((uVar18 & 0xffff) + (uint)uVar23) * iVar16 + uVar29;
  uVar15 = iVar16 * uVar12;
  do {
    if (0xffffff < (uVar29 + uVar15 ^ uVar29)) {
      if (0xffff < uVar15) break;
      uVar15 = -uVar29 & 0xffff;
    }
    uVar4 = uVar4 << 8;
    if (inData < local_60) {
      bVar26 = *inData;
      inData = inData + 1;
      uVar4 = uVar4 | bVar26;
    }
    uVar15 = uVar15 << 8;
    uVar29 = uVar29 << 8;
  } while( true );
  uVar2 = *(short *)((long)context + 0xc) + 3;
  *(ushort *)((long)context + 0xc) = uVar2;
  if (0xff00 < uVar2 || 0xfa < uVar12) {
    if (*(ushort *)((long)context + 8) == 0) {
      sVar7 = 0x100;
    }
    else {
      eVar3 = enet_symbol_rescale((ENetSymbol *)
                                  ((long)context + (ulong)*(ushort *)((long)context + 8) * 2 * 8));
      uVar23 = *(ushort *)((long)local_70 + 10);
      sVar7 = eVar3 + 0x100;
      context = local_70;
    }
    sVar11 = uVar23 - (uVar23 >> 1);
    *(short *)((long)context + 10) = sVar11;
    *(short *)((long)context + 0xc) = sVar7 + sVar11;
  }
  puVar25 = local_80;
  iVar16 = 0;
LAB_001030d2:
  local_80 = &local_92;
  pEVar17 = local_78;
  uVar22 = local_90;
  iVar5 = iVar16;
  if ((short)puVar25 != (short)iVar16) {
    do {
      local_84 = iVar5;
      uVar12 = (uint)puVar25 & 0xffff;
      uVar13 = (ulong)(uVar12 * 0x10);
      lVar20 = (long)context + uVar13;
      uVar23 = *(ushort *)((long)context + uVar13 + 8);
      lVar6 = lVar20;
      if (uVar23 == 0) {
        lVar6 = uVar22 * 0x10;
        puVar10 = (undefined8 *)((long)context + uVar22 * 2 * 8);
        *(byte *)((long)context + uVar22 * 2 * 8) = bVar27;
        *(undefined1 *)((long)context + lVar6 + 1) = 2;
        *(undefined2 *)((long)context + lVar6 + 2) = 2;
        *(undefined8 *)((long)context + lVar6 + 4) = 0;
        *(undefined4 *)((long)context + lVar6 + 0xc) = 0;
        *(short *)((long)context + uVar13 + 8) = (short)((int)lVar6 + uVar12 * -0x10 >> 4);
      }
      else {
        do {
          bVar26 = *(byte *)(lVar6 + (ulong)uVar23 * 0x10);
          lVar6 = lVar6 + (ulong)uVar23 * 0x10;
          while (iVar5 = (int)lVar6, bVar27 < bVar26) {
            *(short *)(lVar6 + 2) = *(short *)(lVar6 + 2) + 2;
            if (*(ushort *)(lVar6 + 4) == 0) {
              lVar14 = uVar22 * 0x10;
              puVar10 = (undefined8 *)((long)context + uVar22 * 2 * 8);
              *(byte *)((long)context + uVar22 * 2 * 8) = bVar27;
              *(undefined1 *)((long)context + lVar14 + 1) = 2;
              *(undefined2 *)((long)context + lVar14 + 2) = 2;
              *(undefined8 *)((long)context + lVar14 + 4) = 0;
              *(undefined4 *)((long)context + lVar14 + 0xc) = 0;
              *(short *)(lVar6 + 4) = (short)((uint)((int)puVar10 - iVar5) >> 4);
              goto LAB_00103251;
            }
            lVar14 = (ulong)*(ushort *)(lVar6 + 4) * 0x10;
            bVar26 = *(byte *)(lVar6 + lVar14);
            lVar6 = lVar6 + lVar14;
          }
          if (bVar27 <= bVar26) {
            bVar26 = *(byte *)(lVar6 + 1);
            *(short *)(lVar6 + 2) = *(short *)(lVar6 + 2) + 2;
            *(byte *)(lVar6 + 1) = bVar26 + 2;
            *local_80 = (ushort)((uint)(iVar5 - (int)context) >> 4);
            local_80 = (ushort *)(lVar6 + 0xe);
            if (bVar26 == 0) goto LAB_00103264;
            sVar7 = *(short *)(lVar20 + 0xc);
            bVar30 = 0xfb < bVar26;
            local_90 = uVar22;
            goto LAB_00103272;
          }
          uVar23 = *(ushort *)(lVar6 + 6);
        } while (uVar23 != 0);
        lVar14 = uVar22 * 0x10;
        puVar10 = (undefined8 *)((long)context + uVar22 * 2 * 8);
        *(byte *)((long)context + uVar22 * 2 * 8) = bVar27;
        *(undefined1 *)((long)context + lVar14 + 1) = 2;
        *(undefined2 *)((long)context + lVar14 + 2) = 2;
        *(undefined8 *)((long)context + lVar14 + 4) = 0;
        *(undefined4 *)((long)context + lVar14 + 0xc) = 0;
        *(short *)(lVar6 + 6) = (short)((uint)((int)puVar10 - iVar5) >> 4);
      }
LAB_00103251:
      uVar22 = uVar22 + 1;
      *local_80 = (ushort)((uint)((int)puVar10 - (int)context) >> 4);
      local_80 = (ushort *)((long)puVar10 + 0xe);
LAB_00103264:
      *(short *)(lVar20 + 10) = *(short *)(lVar20 + 10) + 5;
      sVar7 = *(short *)(lVar20 + 0xc) + 5;
      bVar30 = false;
      local_90 = uVar22;
LAB_00103272:
      *(ushort *)(lVar20 + 0xc) = sVar7 + 2U;
      if ((bVar30) || (0xff00 < (ushort)(sVar7 + 2U))) {
        if (*(ushort *)(lVar20 + 8) == 0) {
          eVar3 = 0;
        }
        else {
          eVar3 = enet_symbol_rescale((ENetSymbol *)((ulong)*(ushort *)(lVar20 + 8) * 0x10 + lVar20)
                                     );
          context = local_70;
          iVar16 = local_84;
        }
        sVar7 = *(ushort *)(lVar20 + 10) - (*(ushort *)(lVar20 + 10) >> 1);
        *(short *)(lVar20 + 10) = sVar7;
        *(enet_uint16 *)(lVar20 + 0xc) = eVar3 + sVar7;
        pEVar17 = local_78;
      }
      puVar25 = (ushort *)(ulong)*(ushort *)(lVar20 + 0xe);
      uVar22 = local_90;
      iVar5 = local_84;
    } while (*(ushort *)(lVar20 + 0xe) != (ushort)iVar16);
  }
  *local_80 = (ushort)((uint)((int)pEVar17 - (int)context) >> 4);
  if (local_58 <= local_48) {
    return 0;
  }
  *local_48 = bVar27;
  if (local_50 < 2) {
    local_50 = local_50 + 1;
  }
  else {
    local_92 = *(ushort *)((long)context + (ulong)local_92 * 0x10 + 0xe);
    local_50 = 2;
  }
  outData = local_48 + 1;
  if (uVar22 < 0xffe) {
    local_80 = (ushort *)(ulong)local_92;
    local_90 = uVar22;
  }
  else {
    *(undefined8 *)context = 0;
    *(undefined8 *)((long)context + 8) = 0;
    *(undefined4 *)((long)context + 10) = 0x1010001;
    local_92 = 0;
    local_80 = (ushort *)0x0;
    local_50 = 0;
    local_90 = 1;
  }
  goto LAB_00102da2;
}

Assistant:

size_t
enet_range_coder_decompress (void * context, const enet_uint8 * inData, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inEnd = & inData [inLimit];
    enet_uint32 decodeLow = 0, decodeCode = 0, decodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;
#ifdef ENET_CONTEXT_EXCLUSION
    ENetExclude excludes [256];
    ENetExclude * nextExclude = excludes;
#endif
  
    if (rangeCoder == NULL || inLimit <= 0)
      return 0;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    ENET_RANGE_CODER_SEED;

    for (;;)
    {
        ENetSymbol * subcontext, * symbol, * patch;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value = 0;
        enet_uint16 code, under, count, bottom, * parent = & predicted, total;

        for (subcontext = & rangeCoder -> symbols [predicted];
             subcontext != root;
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            if (subcontext -> escapes <= 0)
              continue;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0) 
              ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, 0); 
#endif
            if (subcontext -> escapes >= total)
              continue;
            code = ENET_RANGE_CODER_READ (total);
            if (code < subcontext -> escapes) 
            {
                ENET_RANGE_CODER_DECODE (0, subcontext -> escapes, total); 
                continue;
            }
            code -= subcontext -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0)
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_EXCLUDED); 
            }
            else
#endif
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_NOT_EXCLUDED); 
            }
            bottom = symbol - rangeCoder -> symbols;
            ENET_RANGE_CODER_DECODE (subcontext -> escapes + under, count, total);
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            goto patchContexts;
        }

        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
          ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, ENET_CONTEXT_SYMBOL_MINIMUM);  
#endif
        code = ENET_RANGE_CODER_READ (total);
        if (code < root -> escapes)
        {
            ENET_RANGE_CODER_DECODE (0, root -> escapes, total);
            break;
        }
        code -= root -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_EXCLUDED); 
        }
        else
#endif
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_NOT_EXCLUDED); 
        }
        bottom = symbol - rangeCoder -> symbols;
        ENET_RANGE_CODER_DECODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA;
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    patchContexts:
        for (patch = & rangeCoder -> symbols [predicted];
             patch != subcontext;
             patch = & rangeCoder -> symbols [patch -> parent])
        {
            ENET_CONTEXT_ENCODE (patch, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            if (count <= 0)
            {
                patch -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                patch -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            patch -> total += ENET_SUBCONTEXT_SYMBOL_DELTA; 
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || patch -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (patch, 0);
        }
        * parent = bottom;

        ENET_RANGE_CODER_OUTPUT (value);

        if (order >= ENET_SUBCONTEXT_ORDER)
          predicted = rangeCoder -> symbols [predicted].parent;
        else
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }
                        
    return (size_t) (outData - outStart);
}